

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

size_t __thiscall
(anonymous_namespace)::ExprHasher::
VisitBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
          (ExprHasher *this,
          BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
          e)

{
  size_t sVar1;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> local_10;
  
  local_10.super_ExprBase.impl_ = *(ExprBase *)(this + 8);
  sVar1 = Hash<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>((Expr)this,&local_10);
  sVar1 = HashCombine<(mp::expr::Kind)1,(mp::expr::Kind)47>
                    (sVar1,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)*(Impl **)(this + 0x10)
                    );
  return sVar1;
}

Assistant:

size_t VisitBinary(E e) { return HashCombine(Hash(e, e.lhs()), e.rhs()); }